

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O3

char * CVmObjBigNum::compute_ln_series_into(char *ext1,char *ext2,char *ext3,char *ext4,char *ext5)

{
  ushort *ext;
  unsigned_long val;
  
  compute_abs_diff_into(ext2,ext1,(char *)"\x01");
  increment_abs(ext1);
  compute_quotient_into(ext3,(char *)0x0,ext2,ext1);
  compute_prod_into(ext4,ext3,ext3);
  copy_val(ext1,ext3,0);
  val = 3;
  while( true ) {
    ext = (ushort *)ext1;
    compute_prod_into(ext2,ext3,ext4);
    copy_val(ext3,ext2,0);
    div_by_long(ext2,val,(unsigned_long *)0x0);
    if (((ext2[4] & 8U) != 0) || ((int)(uint)*ext < (int)(short)ext[1] - (int)*(short *)(ext2 + 2)))
    break;
    compute_sum_into(ext5,(char *)ext,ext2);
    val = val + 2;
    ext1 = ext5;
    ext5 = (char *)ext;
  }
  mul_by_long((char *)ext,2);
  return (char *)ext;
}

Assistant:

char *CVmObjBigNum::compute_ln_series_into(char *ext1, char *ext2,
                                           char *ext3, char *ext4,
                                           char *ext5)
{
    /* start at the first term of the series */
    ulong n = 1;
    
    /* subtract one from r1 to yield (x-1) in r2 */
    compute_abs_diff_into(ext2, ext1, get_one());
    
    /* add one to r1 to yield (x+1) */
    increment_abs(ext1);
    
    /* compute (x-1)/(x+1) into r3 - this will be our current power */
    compute_quotient_into(ext3, 0, ext2, ext1);
    
    /* 
     *   compute ((x-1)/(x+1))^2 into r4 - we'll multiply r3 by this on
     *   each iteration to produce the next required power, since we only
     *   need the odd powers 
     */
    compute_prod_into(ext4, ext3, ext3);
    
    /* start out with the first power in our accumulator (r1) */
    copy_val(ext1, ext3, FALSE);
    
    /* iterate until we have a good enough answer */
    for (;;)
    {
        /* compute the next power into r2 */
        compute_prod_into(ext2, ext3, ext4);
        
        /* copy the result into our current power register, r3 */
        copy_val(ext3, ext2, FALSE);
        
        /* advance n */
        n += 2;
        
        /* 
         *   divide the power by n (we'll never have to compute billions of
         *   terms to get our maximum 64k digits of precision, so 'n' will
         *   always be way less than the div_by_long limit of ULONG_MAX/10) 
         */
        div_by_long(ext2, n);
        
        /* if it's too small to notice, we're done */
        if (is_zero(ext2)
            || get_exp(ext1) - get_exp(ext2) > (int)get_prec(ext1))
            break;
        
        /* compute the sum with our accumulator into r5 */
        compute_sum_into(ext5, ext1, ext2);
        
        /* swap r5 and r1 - the new sum is our new accumulator */
        char *tmp = ext5;
        ext5 = ext1;
        ext1 = tmp;
    }
    
    /* multiply the result of the series by 2 */
    mul_by_long(ext1, 2);

    /* return the register containing the result */
    return ext1;
}